

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
GenerateAttributesEncoder
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          int32_t att_id)

{
  pointer pAVar1;
  CornerTable *pCVar2;
  iterator __position;
  TraversalObserver traversal_observer;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar5;
  undefined4 extraout_var_03;
  long lVar6;
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
  *this_00;
  MeshTraversalMethod *pMVar7;
  tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_> this_01;
  undefined4 extraout_var_04;
  long lVar8;
  ulong uVar9;
  MeshTraversalMethod MVar10;
  bool bVar11;
  int32_t att_data_id;
  AttTraverser att_traverser;
  int local_f4;
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> local_f0
  ;
  _Head_base<0UL,_draco::PointsSequencer_*,_false> local_e8;
  MeshAttributeCornerTable *local_e0;
  MeshAttributeIndicesEncodingData *pMStack_d8;
  Mesh *local_d0;
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
  *pMStack_c8;
  undefined1 local_c0 [72];
  uint local_78;
  _Bit_pointer local_70;
  _Bit_type *p_Stack_68;
  uint local_60;
  pointer local_58;
  uint local_50;
  _Bit_pointer local_48;
  pointer local_40;
  pointer pIStack_38;
  pointer local_30;
  
  if ((this->use_single_connectivity_ == true) &&
     (iVar3 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
                _vptr_MeshEdgebreakerEncoderImplInterface[10])(this),
     0 < (int)((ulong)(*(long *)(CONCAT44(extraout_var,iVar3) + 0x18) -
                      *(long *)(CONCAT44(extraout_var,iVar3) + 0x10)) >> 3))) {
    iVar3 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
              _vptr_MeshEdgebreakerEncoderImplInterface[10])(this);
    AttributesEncoder::AddAttributeId
              ((AttributesEncoder *)**(undefined8 **)(CONCAT44(extraout_var_00,iVar3) + 0x10),att_id
              );
    return true;
  }
  iVar3 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
            _vptr_MeshEdgebreakerEncoderImplInterface[10])(this);
  iVar3 = *(int *)(*(long *)(*(long *)(CONCAT44(extraout_var_01,iVar3) + 0x70) + 0xa8) +
                  (long)att_id * 4);
  iVar4 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
            _vptr_MeshEdgebreakerEncoderImplInterface[10])(this);
  lVar6 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_02,iVar4) + 8) + 0x10) +
                   (long)att_id * 8);
  local_f4 = -1;
  pAVar1 = (this->attribute_data_).
           super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->attribute_data_).
                super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
  iVar4 = local_f4;
  if (lVar8 != 0) {
    uVar5 = (lVar8 >> 4) * -0x79435e50d79435e5;
    uVar9 = 0;
    do {
      iVar4 = (int)uVar9;
      if (pAVar1[uVar9].attribute_index == att_id) break;
      uVar9 = (ulong)((int)uVar9 + 1);
      iVar4 = local_f4;
    } while (uVar9 <= uVar5 && uVar5 - uVar9 != 0);
  }
  local_f4 = iVar4;
  if (this->use_single_connectivity_ == false) {
    if (((iVar3 != 0) && (*(int *)(lVar6 + 0x38) != 0)) &&
       ((iVar3 != 1 || (pAVar1[local_f4].connectivity_data.no_interior_seams_ != true)))) {
      lVar6 = (long)local_f4;
      local_c0._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (&pAVar1[lVar6].encoding_data.vertex_to_encoded_attribute_value_index_map,
                 (long)(int)((ulong)((long)pAVar1[lVar6].connectivity_data.
                                           vertex_to_attribute_entry_id_map_.
                                           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    *(long *)&pAVar1[lVar6].connectivity_data.
                                              vertex_to_attribute_entry_id_map_.
                                              super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                              ._M_impl.super__Vector_impl_data) >> 2),
                 (value_type_conflict1 *)local_c0);
      this_00 = (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
                 *)operator_new(0xc0);
      pMStack_d8 = &pAVar1[lVar6].encoding_data;
      local_e0 = &pAVar1[lVar6].connectivity_data;
      local_d0 = this->mesh_;
      (this_00->super_PointsSequencer).out_point_ids_ =
           (vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
            *)0x0;
      (this_00->super_PointsSequencer)._vptr_PointsSequencer =
           (_func_int **)&PTR__MeshTraversalSequencer_001df9a8;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .corner_table_ = (CornerTable *)0x0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .traversal_observer_.att_connectivity_ = (MeshAttributeCornerTable *)0x0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .traversal_observer_.encoding_data_ = (MeshAttributeIndicesEncodingData *)0x0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .traversal_observer_.mesh_ = (Mesh *)0x0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .traversal_observer_.sequencer_ = (PointsSequencer *)0x0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      (this_00->traverser_).
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ._vptr_TraverserBase = (_func_int **)&PTR__DepthFirstTraverser_001df7a8;
      (this_00->traverser_).corner_traversal_stack_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->traverser_).corner_traversal_stack_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->traverser_).corner_traversal_stack_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00->mesh_ = local_d0;
      this_00->encoding_data_ = pMStack_d8;
      this_00->corner_order_ =
           (vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            *)0x0;
      local_c0._64_8_ = (_Bit_type *)0x0;
      local_78 = 0;
      local_58 = (pointer)0x0;
      local_50 = 0;
      local_48 = (_Bit_pointer)0x0;
      local_c0._8_8_ = (CornerTable *)0x0;
      local_c0._16_8_ = (MeshAttributeCornerTable *)0x0;
      local_c0._24_8_ =
           (__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>)0x0;
      local_c0._32_8_ = (Mesh *)0x0;
      local_c0._40_8_ = (PointsSequencer *)0x0;
      local_c0._48_8_ = (pointer)0x0;
      local_c0._56_4_ = 0;
      local_70 = (_Bit_pointer)0x0;
      p_Stack_68 = (_Bit_type *)0x0;
      local_60 = 0;
      local_c0._0_8_ = &PTR__DepthFirstTraverser_001df7a8;
      local_40 = (pointer)0x0;
      pIStack_38 = (pointer)0x0;
      local_30 = (pointer)0x0;
      traversal_observer.encoding_data_ = pMStack_d8;
      traversal_observer.att_connectivity_ = local_e0;
      traversal_observer.mesh_ = local_d0;
      traversal_observer.sequencer_ = (PointsSequencer *)this_00;
      pMStack_c8 = this_00;
      TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::Init((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
              *)local_c0,local_e0,traversal_observer);
      this_00->corner_order_ = &this->processed_connectivity_corners_;
      MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
      ::SetTraverser(this_00,(DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                              *)local_c0);
      local_c0._0_8_ = &PTR__DepthFirstTraverser_001df7a8;
      if (local_40 != (pointer)0x0) {
        operator_delete(local_40,(long)local_30 - (long)local_40);
      }
      TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::~TraverserBase((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                        *)local_c0);
      MVar10 = MESH_TRAVERSAL_DEPTH_FIRST;
      goto LAB_0013d5e2;
    }
    if (*(int *)(lVar6 + 0x38) != 0) {
      pCVar2 = (this->corner_table_)._M_t.
               super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
               _M_t.
               super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
               .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
      local_c0._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (&pAVar1[local_f4].encoding_data.vertex_to_encoded_attribute_value_index_map,
                 (long)(int)((ulong)((long)(pCVar2->vertex_corners_).vector_.
                                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    *(long *)&(pCVar2->vertex_corners_).vector_.
                                              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                    ) >> 2),(value_type_conflict1 *)local_c0);
      (this->attribute_data_).
      super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
      ._M_impl.super__Vector_impl_data._M_start[local_f4].is_connectivity_used = false;
    }
  }
  iVar3 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
            _vptr_MeshEdgebreakerEncoderImplInterface[10])(this);
  iVar3 = EncoderOptionsBase<int>::GetSpeed
                    (*(EncoderOptionsBase<int> **)(CONCAT44(extraout_var_03,iVar3) + 0x60));
  bVar11 = false;
  MVar10 = MESH_TRAVERSAL_DEPTH_FIRST;
  if ((iVar3 == 0) && (bVar11 = false, *(int *)(lVar6 + 0x38) == 0)) {
    if (this->use_single_connectivity_ == true) {
      bVar11 = (int)((ulong)((long)(this->mesh_->super_PointCloud).attributes_.
                                   super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->mesh_->super_PointCloud).attributes_.
                                  super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) < 2;
      MVar10 = (MeshTraversalMethod)bVar11;
    }
    else {
      MVar10 = MESH_TRAVERSAL_PREDICTION_DEGREE;
      bVar11 = true;
    }
  }
  if (bVar11) {
    CreateVertexTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
              ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *)
               local_c0,(MeshAttributeIndicesEncodingData *)this);
    this_00 = (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
               *)local_c0._0_8_;
  }
  else {
    CreateVertexTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
              ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *)
               local_c0,(MeshAttributeIndicesEncodingData *)this);
    this_00 = (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
               *)local_c0._0_8_;
  }
LAB_0013d5e2:
  bVar11 = this_00 !=
           (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
            *)0x0;
  if (bVar11) {
    pMVar7 = &(this->attribute_data_).
              super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
              ._M_impl.super__Vector_impl_data._M_start[local_f4].traversal_method;
    if ((long)local_f4 == -1) {
      pMVar7 = &this->pos_traversal_method_;
    }
    *pMVar7 = MVar10;
    this_01.
    super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
    .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
          )operator_new(0xa8);
    local_e8._M_head_impl = &this_00->super_PointsSequencer;
    SequentialAttributeEncodersController::SequentialAttributeEncodersController
              ((SequentialAttributeEncodersController *)
               this_01.
               super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
               .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl,
               (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
               &local_e8,att_id);
    if ((MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
         *)local_e8._M_head_impl !=
        (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
         *)0x0) {
      (*((PointsSequencer *)&(local_e8._M_head_impl)->_vptr_PointsSequencer)->_vptr_PointsSequencer
        [1])();
    }
    local_e8._M_head_impl = (PointsSequencer *)0x0;
    __position._M_current =
         (this->attribute_encoder_to_data_id_map_).super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->attribute_encoder_to_data_id_map_).super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->attribute_encoder_to_data_id_map_,
                 __position,&local_f4);
    }
    else {
      *__position._M_current = local_f4;
      (this->attribute_encoder_to_data_id_map_).super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    iVar3 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
              _vptr_MeshEdgebreakerEncoderImplInterface[10])(this);
    local_f0._M_t.
    super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
    .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
         (tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>)
         (tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>)
         this_01.
         super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
         .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<draco::AttributesEncoder,std::default_delete<draco::AttributesEncoder>>,std::allocator<std::unique_ptr<draco::AttributesEncoder,std::default_delete<draco::AttributesEncoder>>>>
    ::
    emplace_back<std::unique_ptr<draco::AttributesEncoder,std::default_delete<draco::AttributesEncoder>>>
              ((vector<std::unique_ptr<draco::AttributesEncoder,std::default_delete<draco::AttributesEncoder>>,std::allocator<std::unique_ptr<draco::AttributesEncoder,std::default_delete<draco::AttributesEncoder>>>>
                *)(CONCAT44(extraout_var_04,iVar3) + 0x10),
               (unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                *)&local_f0);
    if ((_Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
         )local_f0._M_t.
          super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
          .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl !=
        (AttributesEncoder *)0x0) {
      (**(code **)(*(long *)local_f0._M_t.
                            super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                            .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl +
                  8))();
    }
    local_f0._M_t.
    super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
    .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
         (tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>)
         (_Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
          )0x0;
    this_00 = (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
               *)0x0;
  }
  if (this_00 !=
      (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
       *)0x0) {
    (*(this_00->super_PointsSequencer)._vptr_PointsSequencer[1])(this_00);
  }
  return bVar11;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::GenerateAttributesEncoder(
    int32_t att_id) {
  // For now, either create one encoder for each attribute or use a single
  // encoder for all attributes. Ideally we can share the same encoder for
  // a sub-set of attributes with the same connectivity (this is especially true
  // for per-vertex attributes).
  if (use_single_connectivity_ && GetEncoder()->num_attributes_encoders() > 0) {
    // We are using single connectivity and we already have an attribute
    // encoder. Add the attribute to the encoder and return.
    GetEncoder()->attributes_encoder(0)->AddAttributeId(att_id);
    return true;
  }
  const int32_t element_type =
      GetEncoder()->mesh()->GetAttributeElementType(att_id);
  const PointAttribute *const att =
      GetEncoder()->point_cloud()->attribute(att_id);
  int32_t att_data_id = -1;
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    if (attribute_data_[i].attribute_index == att_id) {
      att_data_id = i;
      break;
    }
  }
  MeshTraversalMethod traversal_method = MESH_TRAVERSAL_DEPTH_FIRST;
  std::unique_ptr<PointsSequencer> sequencer;
  if (use_single_connectivity_ ||
      att->attribute_type() == GeometryAttribute::POSITION ||
      element_type == MESH_VERTEX_ATTRIBUTE ||
      (element_type == MESH_CORNER_ATTRIBUTE &&
       attribute_data_[att_data_id].connectivity_data.no_interior_seams())) {
    // Per-vertex attribute reached, use the basic corner table to traverse the
    // mesh.
    MeshAttributeIndicesEncodingData *encoding_data;
    if (use_single_connectivity_ ||
        att->attribute_type() == GeometryAttribute::POSITION) {
      encoding_data = &pos_encoding_data_;
    } else {
      encoding_data = &attribute_data_[att_data_id].encoding_data;

      // Ensure we use the correct number of vertices in the encoding data.
      encoding_data->vertex_to_encoded_attribute_value_index_map.assign(
          corner_table_->num_vertices(), -1);

      // Mark the attribute specific connectivity data as not used as we use the
      // position attribute connectivity data.
      attribute_data_[att_data_id].is_connectivity_used = false;
    }

    if (GetEncoder()->options()->GetSpeed() == 0 &&
        att->attribute_type() == GeometryAttribute::POSITION) {
      traversal_method = MESH_TRAVERSAL_PREDICTION_DEGREE;
      if (use_single_connectivity_ && mesh_->num_attributes() > 1) {
        // Make sure we don't use the prediction degree traversal when we encode
        // multiple attributes using the same connectivity.
        // TODO(ostava): We should investigate this and see if the prediction
        // degree can be actually used efficiently for non-position attributes.
        traversal_method = MESH_TRAVERSAL_DEPTH_FIRST;
      }
    }
    // Defining sequencer via a traversal scheme.
    if (traversal_method == MESH_TRAVERSAL_PREDICTION_DEGREE) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef MaxPredictionDegreeTraverser<CornerTable, AttObserver>
          AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    } else if (traversal_method == MESH_TRAVERSAL_DEPTH_FIRST) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef DepthFirstTraverser<CornerTable, AttObserver> AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    }
  } else {
    // Per-corner attribute encoder.
    typedef MeshAttributeIndicesEncodingObserver<MeshAttributeCornerTable>
        AttObserver;
    typedef DepthFirstTraverser<MeshAttributeCornerTable, AttObserver>
        AttTraverser;

    MeshAttributeIndicesEncodingData *const encoding_data =
        &attribute_data_[att_data_id].encoding_data;
    const MeshAttributeCornerTable *const corner_table =
        &attribute_data_[att_data_id].connectivity_data;

    // Ensure we use the correct number of vertices in the encoding data.
    attribute_data_[att_data_id]
        .encoding_data.vertex_to_encoded_attribute_value_index_map.assign(
            attribute_data_[att_data_id].connectivity_data.num_vertices(), -1);

    std::unique_ptr<MeshTraversalSequencer<AttTraverser>> traversal_sequencer(
        new MeshTraversalSequencer<AttTraverser>(mesh_, encoding_data));

    AttObserver att_observer(corner_table, mesh_, traversal_sequencer.get(),
                             encoding_data);

    AttTraverser att_traverser;
    att_traverser.Init(corner_table, att_observer);

    // Set order of corners to simulate the corner order of the decoder.
    traversal_sequencer->SetCornerOrder(processed_connectivity_corners_);
    traversal_sequencer->SetTraverser(att_traverser);
    sequencer = std::move(traversal_sequencer);
  }

  if (!sequencer) {
    return false;
  }

  if (att_data_id == -1) {
    pos_traversal_method_ = traversal_method;
  } else {
    attribute_data_[att_data_id].traversal_method = traversal_method;
  }

  std::unique_ptr<SequentialAttributeEncodersController> att_controller(
      new SequentialAttributeEncodersController(std::move(sequencer), att_id));

  // Update the mapping between the encoder id and the attribute data id.
  // This will be used by the decoder to select the appropriate attribute
  // decoder and the correct connectivity.
  attribute_encoder_to_data_id_map_.push_back(att_data_id);
  GetEncoder()->AddAttributesEncoder(std::move(att_controller));
  return true;
}